

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O2

void __thiscall Pl_QPDFTokenizer::~Pl_QPDFTokenizer(Pl_QPDFTokenizer *this)

{
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_QPDFTokenizer_002ac690;
  std::unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
  ~unique_ptr(&this->m);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_QPDFTokenizer::~Pl_QPDFTokenizer() = default;